

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priest.c
# Opt level: O0

boolean in_your_sanctuary(monst *mon,xchar x,xchar y)

{
  char roomno_00;
  boolean bVar1;
  char *pcVar2;
  monst *pri;
  bool local_2d;
  monst *priest;
  char roomno;
  xchar y_local;
  xchar x_local;
  monst *mon_local;
  
  priest._6_1_ = y;
  priest._7_1_ = x;
  if (mon != (monst *)0x0) {
    if (((((mon->data->mflags2 & 0x2000) != 0) || (mon->data == mons + 0x144)) ||
        (mon->data == mons + 0x146)) || (mon->data == mons + 0x145)) {
      return '\0';
    }
    priest._7_1_ = mon->mx;
    priest._6_1_ = mon->my;
  }
  if (((-4 < u.ualign.record) && (roomno_00 = temple_occupied(u.urooms), roomno_00 != '\0')) &&
     (pcVar2 = in_rooms(level,priest._7_1_,priest._6_1_,10), roomno_00 == *pcVar2)) {
    pri = findpriest(roomno_00);
    if (pri != (monst *)0x0) {
      bVar1 = has_shrine(pri);
      local_2d = false;
      if (bVar1 != '\0') {
        bVar1 = p_coaligned(pri);
        local_2d = false;
        if (bVar1 != '\0') {
          local_2d = (*(uint *)&pri->field_0x60 >> 0x16 & 1) != 0;
        }
      }
      return local_2d;
    }
    return '\0';
  }
  return '\0';
}

Assistant:

boolean in_your_sanctuary(struct monst *mon, /* if non-null, <mx,my> overrides <x,y> */
			  xchar x, xchar y)
{
	char roomno;
	struct monst *priest;

	if (mon) {
	    if (is_minion(mon->data) || is_rider(mon->data)) return FALSE;
	    x = mon->mx, y = mon->my;
	}
	if (u.ualign.record <= ALGN_SINNED)	/* sinned or worse */
	    return FALSE;
	if ((roomno = temple_occupied(u.urooms)) == 0 ||
		roomno != *in_rooms(level, x, y, TEMPLE))
	    return FALSE;
	if ((priest = findpriest(roomno)) == 0)
	    return FALSE;
	return (boolean)(has_shrine(priest) &&
			 p_coaligned(priest) &&
			 priest->mpeaceful);
}